

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O2

void __thiscall
testing::internal::FunctionMockerBase<void_(int_*,_unsigned_long)>::FunctionMockerBase
          (FunctionMockerBase<void_(int_*,_unsigned_long)> *this)

{
  UntypedFunctionMockerBase::UntypedFunctionMockerBase(&this->super_UntypedFunctionMockerBase);
  (this->super_UntypedFunctionMockerBase)._vptr_UntypedFunctionMockerBase =
       (_func_int **)&PTR__FunctionMockerBase_002623c0;
  (this->current_spec_).function_mocker_ = this;
  (this->current_spec_).matchers_.f0_.super_MatcherBase<int_*>.impl_.value_ =
       (MatcherInterface<int_*> *)0x0;
  (this->current_spec_).matchers_.f0_.super_MatcherBase<int_*>.impl_.link_.next_ =
       &(this->current_spec_).matchers_.f0_.super_MatcherBase<int_*>.impl_.link_;
  (this->current_spec_).matchers_.f0_.super_MatcherBase<int_*>._vptr_MatcherBase =
       (_func_int **)&PTR__MatcherBase_002624a0;
  (this->current_spec_).matchers_.f1_.super_MatcherBase<unsigned_long>.impl_.value_ =
       (MatcherInterface<unsigned_long> *)0x0;
  (this->current_spec_).matchers_.f1_.super_MatcherBase<unsigned_long>.impl_.link_.next_ =
       &(this->current_spec_).matchers_.f1_.super_MatcherBase<unsigned_long>.impl_.link_;
  (this->current_spec_).matchers_.f1_.super_MatcherBase<unsigned_long>._vptr_MatcherBase =
       (_func_int **)&PTR__MatcherBase_002624d8;
  return;
}

Assistant:

FunctionMockerBase() : current_spec_(this) {}